

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_messaging_ll.c
# Opt level: O3

IOTHUB_MESSAGING_RESULT
IoTHubMessaging_LL_Send
          (IOTHUB_MESSAGING_HANDLE messagingHandle,char *deviceId,IOTHUB_MESSAGE_HANDLE message,
          IOTHUB_SEND_COMPLETE_CALLBACK sendCompleteCallback,void *userContextCallback)

{
  int iVar1;
  IOTHUBMESSAGE_CONTENT_TYPE IVar2;
  IOTHUB_MESSAGE_RESULT IVar3;
  size_t sVar4;
  char *pcVar5;
  LOGGER_LOG p_Var6;
  uchar *__s;
  MESSAGE_HANDLE message_00;
  AMQP_VALUE to_amqp_value;
  SEND_CALLBACK_DATA *send_data;
  ASYNC_OPERATION_HANDLE pAVar7;
  char *pcVar8;
  IOTHUB_MESSAGING_RESULT IVar9;
  BINARY_DATA amqp_data;
  uchar *contentByteArr;
  size_t local_40;
  uchar *local_38;
  
  if (messagingHandle == (IOTHUB_MESSAGING_HANDLE)0x0) {
    p_Var6 = xlogging_get_log_function();
    if (p_Var6 == (LOGGER_LOG)0x0) {
      return IOTHUB_MESSAGING_INVALID_ARG;
    }
    pcVar5 = "Input parameter messagingHandle cannot be NULL";
    IVar9 = IOTHUB_MESSAGING_INVALID_ARG;
    iVar1 = 0x5a6;
    goto LAB_00130b9b;
  }
  if (deviceId == (char *)0x0) {
    p_Var6 = xlogging_get_log_function();
    if (p_Var6 == (LOGGER_LOG)0x0) {
      return IOTHUB_MESSAGING_INVALID_ARG;
    }
    pcVar5 = "Input parameter deviceId cannot be NULL";
    IVar9 = IOTHUB_MESSAGING_INVALID_ARG;
    iVar1 = 0x5ab;
    goto LAB_00130b9b;
  }
  if (message == (IOTHUB_MESSAGE_HANDLE)0x0) {
    p_Var6 = xlogging_get_log_function();
    if (p_Var6 == (LOGGER_LOG)0x0) {
      return IOTHUB_MESSAGING_INVALID_ARG;
    }
    pcVar5 = "Input parameter message cannot be NULL";
    IVar9 = IOTHUB_MESSAGING_INVALID_ARG;
    iVar1 = 0x5b0;
    goto LAB_00130b9b;
  }
  if (messagingHandle->isOpened == 0) {
    p_Var6 = xlogging_get_log_function();
    IVar9 = IOTHUB_MESSAGING_ERROR;
    if (p_Var6 == (LOGGER_LOG)0x0) {
      return IOTHUB_MESSAGING_ERROR;
    }
    pcVar5 = "Messaging is not opened - call IoTHubMessaging_LL_Open to open";
    iVar1 = 0x5b5;
    goto LAB_00130b9b;
  }
  if (messagingHandle->max_send_queue_size <= messagingHandle->send_queue_size) {
    p_Var6 = xlogging_get_log_function();
    IVar9 = IOTHUB_MESSAGING_QUEUE_FULL;
    if (p_Var6 == (LOGGER_LOG)0x0) {
      return IOTHUB_MESSAGING_QUEUE_FULL;
    }
    pcVar5 = "Send queue is full";
    iVar1 = 0x5ba;
    goto LAB_00130b9b;
  }
  sVar4 = strlen(deviceId);
  pcVar5 = (char *)malloc(sVar4 + 0x2c);
  if (pcVar5 == (char *)0x0) {
    p_Var6 = xlogging_get_log_function();
    if (p_Var6 != (LOGGER_LOG)0x0) {
      (*p_Var6)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                ,"createDeviceDestinationString",0x28e,1,
                "Could not create device destination string.");
    }
  }
  else {
    iVar1 = snprintf(pcVar5,sVar4 + 0x2c,"/devices/%s/messages/deviceBound",deviceId);
    if (-1 < iVar1) {
      IVar2 = IoTHubMessage_GetContentType(message);
      if (IVar2 == IOTHUBMESSAGE_STRING) {
        __s = (uchar *)IoTHubMessage_GetString(message);
        if (__s == (uchar *)0x0) {
          p_Var6 = xlogging_get_log_function();
          if (p_Var6 != (LOGGER_LOG)0x0) {
            pcVar8 = 
            "Failed getting the STRING representation of the IOTHUB_MESSAGE_HANDLE instance.";
            iVar1 = 0x1b7;
            goto LAB_00130ced;
          }
          goto LAB_00130cf8;
        }
        sVar4 = strlen((char *)__s);
LAB_00130c12:
        message_00 = message_create();
        if (message_00 != (MESSAGE_HANDLE)0x0) {
          to_amqp_value = amqpvalue_create_string(pcVar5);
          if (to_amqp_value == (AMQP_VALUE)0x0) {
            p_Var6 = xlogging_get_log_function();
            IVar9 = IOTHUB_MESSAGING_ERROR;
            if (p_Var6 != (LOGGER_LOG)0x0) {
              (*p_Var6)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                        ,"IoTHubMessaging_LL_Send",0x5da,1,
                        "Could not create properties for message - amqpvalue_create_string");
            }
          }
          else {
            amqp_data.length = sVar4;
            amqp_data.bytes = __s;
            iVar1 = message_add_body_amqp_data(message_00,amqp_data);
            if (iVar1 == 0) {
              iVar1 = addPropertiesToAMQPMessage(message,message_00,to_amqp_value);
              if (iVar1 == 0) {
                iVar1 = addApplicationPropertiesToAMQPMessage(message,message_00);
                if (iVar1 == 0) {
                  send_data = enqueue_send_callback_data
                                        (messagingHandle,sendCompleteCallback,userContextCallback);
                  if (send_data == (SEND_CALLBACK_DATA *)0x0) {
                    p_Var6 = xlogging_get_log_function();
                    IVar9 = IOTHUB_MESSAGING_ERROR;
                    if (p_Var6 != (LOGGER_LOG)0x0) {
                      pcVar8 = "Failed enqueueing message.";
                      iVar1 = 0x5fa;
                      goto LAB_00130e03;
                    }
                  }
                  else {
                    IVar9 = IOTHUB_MESSAGING_OK;
                    pAVar7 = messagesender_send_async
                                       (messagingHandle->message_sender,message_00,
                                        IoTHubMessaging_LL_SendMessageComplete,send_data,0);
                    if (pAVar7 == (ASYNC_OPERATION_HANDLE)0x0) {
                      p_Var6 = xlogging_get_log_function();
                      if (p_Var6 != (LOGGER_LOG)0x0) {
                        (*p_Var6)(AZ_LOG_ERROR,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                                  ,"IoTHubMessaging_LL_Send",0x5ff,1,
                                  "messagesender_send_async failed.");
                      }
                      dequeue_send_callback_data(send_data);
                      IVar9 = IOTHUB_MESSAGING_ERROR;
                    }
                  }
                }
                else {
                  p_Var6 = xlogging_get_log_function();
                  IVar9 = IOTHUB_MESSAGING_ERROR;
                  if (p_Var6 != (LOGGER_LOG)0x0) {
                    pcVar8 = "Failed setting application properties of the uAMQP message.";
                    iVar1 = 0x5f1;
                    goto LAB_00130e03;
                  }
                }
              }
              else {
                p_Var6 = xlogging_get_log_function();
                IVar9 = IOTHUB_MESSAGING_ERROR;
                if (p_Var6 != (LOGGER_LOG)0x0) {
                  pcVar8 = "Failed setting properties of the uAMQP message.";
                  iVar1 = 0x5ec;
                  goto LAB_00130e03;
                }
              }
            }
            else {
              p_Var6 = xlogging_get_log_function();
              IVar9 = IOTHUB_MESSAGING_ERROR;
              if (p_Var6 != (LOGGER_LOG)0x0) {
                pcVar8 = "Failed setting the body of the uAMQP message.";
                iVar1 = 0x5e7;
LAB_00130e03:
                IVar9 = IOTHUB_MESSAGING_ERROR;
                (*p_Var6)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                          ,"IoTHubMessaging_LL_Send",iVar1,1,pcVar8);
              }
            }
            amqpvalue_destroy(to_amqp_value);
          }
          message_destroy(message_00);
          goto LAB_00130e1e;
        }
        p_Var6 = xlogging_get_log_function();
        IVar9 = IOTHUB_MESSAGING_ERROR;
        if (p_Var6 == (LOGGER_LOG)0x0) goto LAB_00130e1e;
        pcVar8 = "Could not create a message.";
        iVar1 = 0x5d3;
      }
      else {
        if (IVar2 == IOTHUBMESSAGE_BYTEARRAY) {
          IVar3 = IoTHubMessage_GetByteArray(message,&local_38,&local_40);
          sVar4 = local_40;
          __s = local_38;
          if (IVar3 == IOTHUB_MESSAGE_OK) goto LAB_00130c12;
          p_Var6 = xlogging_get_log_function();
          if (p_Var6 != (LOGGER_LOG)0x0) {
            pcVar8 = 
            "Failed getting the BYTE array representation of the IOTHUB_MESSAGE_HANDLE instance.";
            iVar1 = 0x1aa;
            goto LAB_00130ced;
          }
        }
        else {
          p_Var6 = xlogging_get_log_function();
          if (p_Var6 != (LOGGER_LOG)0x0) {
            pcVar8 = "Cannot parse IOTHUB_MESSAGE_HANDLE with content type IOTHUBMESSAGE_UNKNOWN.";
            iVar1 = 0x1c3;
LAB_00130ced:
            (*p_Var6)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                      ,"getMessageContentAndSize",iVar1,1,pcVar8);
          }
        }
LAB_00130cf8:
        p_Var6 = xlogging_get_log_function();
        IVar9 = IOTHUB_MESSAGING_ERROR;
        if (p_Var6 == (LOGGER_LOG)0x0) goto LAB_00130e1e;
        pcVar8 = 
        "Failed getting the message content and message size from IOTHUB_MESSAGE_HANDLE instance.";
        iVar1 = 0x5c9;
      }
      IVar9 = IOTHUB_MESSAGING_ERROR;
      (*p_Var6)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                ,"IoTHubMessaging_LL_Send",iVar1,1,pcVar8);
LAB_00130e1e:
      free(pcVar5);
      return IVar9;
    }
    p_Var6 = xlogging_get_log_function();
    if (p_Var6 != (LOGGER_LOG)0x0) {
      (*p_Var6)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                ,"createDeviceDestinationString",0x295,1,
                "sprintf_s failed for deviceDestinationString.");
    }
    free(pcVar5);
  }
  p_Var6 = xlogging_get_log_function();
  IVar9 = IOTHUB_MESSAGING_ERROR;
  if (p_Var6 == (LOGGER_LOG)0x0) {
    return IOTHUB_MESSAGING_ERROR;
  }
  pcVar5 = "Could not create a message.";
  iVar1 = 0x5bf;
LAB_00130b9b:
  (*p_Var6)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
            ,"IoTHubMessaging_LL_Send",iVar1,1,pcVar5);
  return IVar9;
}

Assistant:

IOTHUB_MESSAGING_RESULT IoTHubMessaging_LL_Send(IOTHUB_MESSAGING_HANDLE messagingHandle, const char* deviceId, IOTHUB_MESSAGE_HANDLE message, IOTHUB_SEND_COMPLETE_CALLBACK sendCompleteCallback, void* userContextCallback)
{
    IOTHUB_MESSAGING_RESULT result;

    // There is no support for module sending message for callers, but most of plumbing is available should this be enabled via a new API.
    const char* moduleId = NULL;

    char* deviceDestinationString;

    if (messagingHandle == NULL)
    {
        LogError("Input parameter messagingHandle cannot be NULL");
        result = IOTHUB_MESSAGING_INVALID_ARG;
    }
    else if (deviceId == NULL)
    {
        LogError("Input parameter deviceId cannot be NULL");
        result = IOTHUB_MESSAGING_INVALID_ARG;
    }
    else if (message == NULL)
    {
        LogError("Input parameter message cannot be NULL");
        result = IOTHUB_MESSAGING_INVALID_ARG;
    }
    else if (messagingHandle->isOpened == 0)
    {
        LogError("Messaging is not opened - call IoTHubMessaging_LL_Open to open");
        result = IOTHUB_MESSAGING_ERROR;
    }
    else if (is_send_queue_full(messagingHandle))
    {
        LogError("Send queue is full");
        result = IOTHUB_MESSAGING_QUEUE_FULL;
    }
    else if ((deviceDestinationString = createDeviceDestinationString(deviceId, moduleId)) == NULL)
    {
        LogError("Could not create a message.");
        result = IOTHUB_MESSAGING_ERROR;
    }
    else
    {
        unsigned const char* messageContent;
        size_t messageContentSize;

        if (getMessageContentAndSize(message, &messageContent, &messageContentSize) != 0)
        {
            LogError("Failed getting the message content and message size from IOTHUB_MESSAGE_HANDLE instance.");
            result = IOTHUB_MESSAGING_ERROR;
        }
        else
        {
            MESSAGE_HANDLE amqpMessage;
            AMQP_VALUE to_amqp_value;

            if ((amqpMessage = message_create()) == NULL)
            {
                LogError("Could not create a message.");
                result = IOTHUB_MESSAGING_ERROR;
            }
            else
            {
                if ((to_amqp_value = amqpvalue_create_string(deviceDestinationString)) == NULL)
                {
                    LogError("Could not create properties for message - amqpvalue_create_string");
                    result = IOTHUB_MESSAGING_ERROR;
                }
                else
                {
                    BINARY_DATA binary_data;

                    binary_data.bytes = messageContent;
                    binary_data.length = messageContentSize;

                    if (message_add_body_amqp_data(amqpMessage, binary_data) != 0)
                    {
                        
                        LogError("Failed setting the body of the uAMQP message.");
                        result = IOTHUB_MESSAGING_ERROR;
                    }
                    else if (addPropertiesToAMQPMessage(message, amqpMessage, to_amqp_value) != 0)
                    {
                        LogError("Failed setting properties of the uAMQP message.");
                        result = IOTHUB_MESSAGING_ERROR;
                    }
                    else if (addApplicationPropertiesToAMQPMessage(message, amqpMessage) != 0)
                    {
                        LogError("Failed setting application properties of the uAMQP message.");
                        result = IOTHUB_MESSAGING_ERROR;
                    }
                    else
                    {
                        SEND_CALLBACK_DATA* send_data = enqueue_send_callback_data(messagingHandle, sendCompleteCallback, userContextCallback);

                        if (send_data == NULL)
                        {
                            LogError("Failed enqueueing message.");
                            result = IOTHUB_MESSAGING_ERROR;
                        }
                        else if (messagesender_send_async(messagingHandle->message_sender, amqpMessage, IoTHubMessaging_LL_SendMessageComplete, send_data, 0) == NULL)
                        {
                            LogError("messagesender_send_async failed.");
                            dequeue_send_callback_data(send_data);
                            result = IOTHUB_MESSAGING_ERROR;
                        }
                        else
                        {
                            result = IOTHUB_MESSAGING_OK;
                        }
                    }
                    amqpvalue_destroy(to_amqp_value);
                }
                message_destroy(amqpMessage);
            }
        }
        free(deviceDestinationString);
    }
    return result;
}